

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClassList *stm)

{
  long lVar1;
  __uniq_ptr_impl<CClass,_std::default_delete<CClass>_> _Var2;
  pointer puVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_50 [8];
  char local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: classlist\n",0x17);
  puVar3 = (stm->classes).
           super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((stm->classes).
      super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    uVar5 = 0;
    do {
      if (puVar3[uVar5]._M_t.super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t.
          super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
          super__Head_base<0UL,_CClass_*,_false>._M_head_impl == (CClass *)0x0) {
        CError::CError((CError *)local_60,&CError::AST_ERROR_abi_cxx11_,
                       &(stm->super_IWrapper).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                  (&this->errors,(CError *)local_60);
        pcVar4 = local_50;
        local_58._M_p = (pointer)local_60;
        goto LAB_00122c4b;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Accepting of class: \n",0x15);
      lVar1 = *(long *)((long)(stm->classes).
                              super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
                              super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t +
                       0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,*(char **)(lVar1 + 0x18),*(long *)(lVar1 + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nLet\'s begin\n",0xd);
      _Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
      super__Head_base<0UL,_CClass_*,_false>._M_head_impl =
           (stm->classes).
           super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_t.
           super___uniq_ptr_impl<CClass,_std::default_delete<CClass>_>._M_t;
      (*(code *)**(undefined8 **)
                  _Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
                  super__Head_base<0UL,_CClass_*,_false>._M_head_impl)
                (_Var2._M_t.super__Tuple_impl<0UL,_CClass_*,_std::default_delete<CClass>_>.
                 super__Head_base<0UL,_CClass_*,_false>._M_head_impl,this);
      uVar5 = uVar5 + 1;
      puVar3 = (stm->classes).
               super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(stm->classes).
                                   super__Vector_base<std::unique_ptr<CClass,_std::default_delete<CClass>_>,_std::allocator<std::unique_ptr<CClass,_std::default_delete<CClass>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  TypeInfo::TypeInfo((TypeInfo *)local_60,VOID);
  (this->lastCalculatedType).isPrimitive = (bool)local_60[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_60._1_3_;
  (this->lastCalculatedType).type = local_60._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_58);
  pcVar4 = local_48;
LAB_00122c4b:
  if (local_58._M_p != pcVar4) {
    operator_delete(local_58._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CClassList &stm ) 
{
	std::cout << "typechecker: classlist\n";
    bool areAllClassBuilt = true;
    for (int index = 0; index < stm.classes.size(); ++index) {;
        if( !stm.classes[index]) {
            areAllClassBuilt = false;
            break;
        }
        std::cout << "Accepting of class: \n";
        std::cout << stm.classes[index]->id->name;
        std::cout << "\nLet's begin\n";
        stm.classes[index]->Accept( *this );
    }
    if( areAllClassBuilt ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}